

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cpp
# Opt level: O1

void __thiscall
hedg::params::market_catalogue::market_catalogue
          (market_catalogue *this,string *session_id_,string *start_time_,string *end_time_,
          string *end_point_,string *event_type_ids_,string *market_type_codes_,
          string *market_countries_,string *max_results_,string *market_projection_)

{
  pointer pcVar1;
  
  (this->session_id)._M_dataplus._M_p = (pointer)&(this->session_id).field_2;
  pcVar1 = (session_id_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + session_id_->_M_string_length);
  (this->start_time)._M_dataplus._M_p = (pointer)&(this->start_time).field_2;
  pcVar1 = (start_time_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->start_time,pcVar1,pcVar1 + start_time_->_M_string_length);
  (this->end_time)._M_dataplus._M_p = (pointer)&(this->end_time).field_2;
  pcVar1 = (end_time_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->end_time,pcVar1,pcVar1 + end_time_->_M_string_length);
  (this->end_point)._M_dataplus._M_p = (pointer)&(this->end_point).field_2;
  pcVar1 = (end_point_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->end_point,pcVar1,pcVar1 + end_point_->_M_string_length);
  (this->event_type_ids)._M_dataplus._M_p = (pointer)&(this->event_type_ids).field_2;
  pcVar1 = (event_type_ids_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->event_type_ids,pcVar1,pcVar1 + event_type_ids_->_M_string_length);
  (this->market_type_codes)._M_dataplus._M_p = (pointer)&(this->market_type_codes).field_2;
  pcVar1 = (market_type_codes_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->market_type_codes,pcVar1,pcVar1 + market_type_codes_->_M_string_length
            );
  (this->max_results)._M_dataplus._M_p = (pointer)&(this->max_results).field_2;
  pcVar1 = (max_results_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->max_results,pcVar1,pcVar1 + max_results_->_M_string_length);
  (this->market_projection)._M_dataplus._M_p = (pointer)&(this->market_projection).field_2;
  pcVar1 = (market_projection_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->market_projection,pcVar1,pcVar1 + market_projection_->_M_string_length
            );
  (this->market_countries)._M_dataplus._M_p = (pointer)&(this->market_countries).field_2;
  pcVar1 = (market_countries_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->market_countries,pcVar1,pcVar1 + market_countries_->_M_string_length);
  return;
}

Assistant:

market_catalogue::market_catalogue(std::string session_id_, std::string start_time_, std::string end_time_, std::string end_point_, std::string event_type_ids_,
		std::string market_type_codes_, std::string market_countries_ , std::string max_results_ ,std::string market_projection_)
		:session_id{ session_id_ }, start_time{ start_time_ }, end_time{ end_time_ }, end_point{end_point_}, event_type_ids{ event_type_ids_ },
		market_type_codes{ market_type_codes_ }, market_countries{ market_countries_ }, max_results{ max_results_ },
		market_projection{ market_projection_ } {}